

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

MemoryChunk * __thiscall HACD::MyMicroAllocator::isMicroAlloc(MyMicroAllocator *this,void *p)

{
  MemoryChunk *pMVar1;
  ulong uVar2;
  MicroChunk *pMVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->super_MemMutex);
  if ((p < this->mChunkStart) || (this->mChunkEnd <= p)) {
    uVar2 = (ulong)this->mMicroChunkCount;
    if (uVar2 == 0) {
      pMVar1 = (MemoryChunk *)0x0;
    }
    else {
      pMVar3 = this->mLastMicroChunk;
      if (((pMVar3 == (MicroChunk *)0x0) || (p < pMVar3->mMemStart)) || (pMVar3->mMemEnd <= p)) {
        if (this->mMicroChunkCount < 4) {
          pMVar3 = this->mMicroChunks;
          pMVar1 = (MemoryChunk *)0x0;
          do {
            if ((pMVar3->mMemStart <= p) && (p < pMVar3->mMemEnd)) {
              pMVar1 = pMVar3->mChunk;
              if ((p < pMVar1->mData) || (pMVar1->mDataEnd <= p)) {
                __assert_fail("ret->isInside(s)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACD/hacdMicroAllocator.cpp"
                              ,0x229,
                              "virtual MemoryChunk *HACD::MyMicroAllocator::isMicroAlloc(const void *)"
                             );
              }
              this->mLastMicroChunk = pMVar3;
              break;
            }
            pMVar3 = pMVar3 + 1;
            uVar2 = uVar2 - 1;
          } while (uVar2 != 0);
        }
        else {
          pMVar1 = binarySearchMicroChunks(this,(NxU8 *)p);
        }
      }
      else {
        pMVar1 = pMVar3->mChunk;
      }
    }
  }
  else {
    uVar2 = (ulong)(uint)((int)p - (int)this->mChunkStart) / (ulong)this->mChunkSize;
    if (5 < (uint)uVar2) {
      __assert_fail("index>=0 && index < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACD/hacdMicroAllocator.cpp"
                    ,0x205,"virtual MemoryChunk *HACD::MyMicroAllocator::isMicroAlloc(const void *)"
                   );
    }
    if ((p < this->mAlloc[uVar2].mChunks.mChunks[0].mData) ||
       (this->mAlloc[uVar2].mChunks.mChunks[0].mDataEnd <= p)) {
      __assert_fail("ret->isInside(s)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACD/hacdMicroAllocator.cpp"
                    ,0x207,"virtual MemoryChunk *HACD::MyMicroAllocator::isMicroAlloc(const void *)"
                   );
    }
    pMVar1 = this->mAlloc[uVar2].mChunks.mChunks;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->super_MemMutex);
  return pMVar1;
}

Assistant:

virtual MemoryChunk *   isMicroAlloc(const void *p)  // returns true if this pointer is handled by the micro-allocator.
  {
    MemoryChunk *ret = 0;

	Lock();

    const NxU8 *s = (const NxU8 *)p;

    if ( s >= mChunkStart && s < mChunkEnd )
    {
        NxU32 index = (NxU32)(s-mChunkStart)/mChunkSize;
        assert(index>=0 && index < 6 );
        ret = &mAlloc[index].mChunks.mChunks[0];
		assert( ret->isInside(s) );
    }
	else if ( mMicroChunkCount )
	{
        if ( mLastMicroChunk && mLastMicroChunk->inside(s) )
        {
            ret = mLastMicroChunk->mChunk;
        }
        else
        {
			if ( mMicroChunkCount >= 4 )
			{
				ret = binarySearchMicroChunks(s);
#ifdef _DEBUG
				if (ret )
				{
					assert( ret->isInside(s) );
				}
				else 
				{
					for (NxU32 i=0; i<mMicroChunkCount; i++)
					{
						assert( !mMicroChunks[i].inside(s) );
					}
				}
#endif
			}
			else
			{
				for (NxU32 i=0; i<mMicroChunkCount; i++)
				{
					if ( mMicroChunks[i].inside(s) )
					{
						ret = mMicroChunks[i].mChunk;
						assert( ret->isInside(s) );
						mLastMicroChunk = &mMicroChunks[i];
						break;
					}
				}
			}
        }
	}
#ifdef _DEBUG
	if ( ret )
		assert( ret->isInside(s) );
#endif
	Unlock();
    return ret;
  }